

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.h
# Opt level: O0

void __thiscall
ForStatement::GenerateStatementInline(ForStatement *this,ostream *out,int n,StatementPtr *statement)

{
  uint uVar1;
  element_type *peVar2;
  char *pcVar3;
  bool bVar4;
  undefined1 local_1d0 [8];
  string text;
  ostringstream local_1a0 [8];
  ostringstream statementBuffer;
  StatementPtr *statement_local;
  int n_local;
  ostream *out_local;
  ForStatement *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  peVar2 = std::__shared_ptr_access<Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      statement);
  (*peVar2->_vptr_Statement[1])(peVar2,local_1a0,0);
  std::__cxx11::ostringstream::str();
  while( true ) {
    uVar1 = std::__cxx11::string::empty();
    bVar4 = false;
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::length();
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_1d0);
      bVar4 = true;
      if (*pcVar3 != '\n') {
        std::__cxx11::string::length();
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_1d0);
        bVar4 = *pcVar3 == ';';
      }
    }
    if (!bVar4) break;
    std::__cxx11::string::length();
    std::__cxx11::string::resize((ulong)local_1d0);
  }
  AssureIndents((string *)local_1d0,n);
  std::operator<<(out,(string *)local_1d0);
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

void GenerateStatementInline( std::ostream& out, int n, StatementPtr statement ) const
	{
		std::ostringstream statementBuffer;
		statement->GenerateCode(statementBuffer, 0);

		std::string text = statementBuffer.str();

		while (!text.empty() && (text[text.length()-1] == '\n' || text[text.length()-1] == ';'))
			text.resize(text.length()-1); //remove last element

		AssureIndents(text, n);

		out << text;
	}